

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hh_portable.h
# Opt level: O0

void __thiscall highwayhash::Portable::HHStatePortable::Reset(HHStatePortable *this,uint64_t *keys)

{
  uint64_t local_38;
  Lanes rotated_keys;
  uint64_t *keys_local;
  HHStatePortable *this_local;
  
  rotated_keys[3] = (uint64_t)keys;
  Rotate64By32<unsigned_long_const*>((unsigned_long **)(rotated_keys + 3),(Lanes *)&local_38);
  Copy(&Reset::init0,&this->mul0);
  Copy(&Reset::init1,&this->mul1);
  Xor<unsigned_long_const*>(&Reset::init0,(unsigned_long **)(rotated_keys + 3),this->v0);
  Xor<unsigned_long[4]>(&Reset::init1,(unsigned_long (*) [4])&local_38,&this->v1);
  return;
}

Assistant:

HH_INLINE void Reset(const HHKey keys) {
    static const Lanes init0 = {0xdbe6d5d5fe4cce2full, 0xa4093822299f31d0ull,
                                0x13198a2e03707344ull, 0x243f6a8885a308d3ull};
    static const Lanes init1 = {0x3bd39e10cb0ef593ull, 0xc0acf169b5f18a8cull,
                                0xbe5466cf34e90c6cull, 0x452821e638d01377ull};
    Lanes rotated_keys;
    Rotate64By32(keys, &rotated_keys);
    Copy(init0, &mul0);
    Copy(init1, &mul1);
    Xor(init0, keys, &v0);
    Xor(init1, rotated_keys, &v1);
  }